

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * lua_pushexternalstring(lua_State *L,char *s,size_t len,lua_Alloc falloc,void *ud)

{
  StkId pSVar1;
  TString *pTVar2;
  TString *x_;
  char **ppcVar3;
  
  pTVar2 = luaS_newextlstr(L,s,len,falloc,ud);
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = pTVar2;
  (pSVar1->val).tt_ = pTVar2->tt | 0x40;
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  ppcVar3 = &pTVar2->contents;
  if (pTVar2->shrlen < '\0') {
    ppcVar3 = (char **)*ppcVar3;
  }
  return (char *)ppcVar3;
}

Assistant:

LUA_API const char *lua_pushexternalstring (lua_State *L,
	        const char *s, size_t len, lua_Alloc falloc, void *ud) {
  TString *ts;
  lua_lock(L);
  api_check(L, len <= MAX_SIZE, "string too large");
  api_check(L, s[len] == '\0', "string not ending with zero");
  ts = luaS_newextlstr (L, s, len, falloc, ud);
  setsvalue2s(L, L->top.p, ts);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return getstr(ts);
}